

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseVectorSum.h
# Opt level: O0

void __thiscall HighsSparseVectorSum::clear(HighsSparseVectorSum *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference piVar4;
  reference pvVar5;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *this_00;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  HighsInt i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffa0;
  HighsCDouble local_48;
  HighsCDouble local_38;
  int local_24;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *local_10;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
  sVar3 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::size(in_RDI);
  if (sVar2 * 10 < sVar3 * 3) {
    local_10 = in_RDI + 1;
    local_18._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff98);
    local_20 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffffa0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff98), bVar1) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_18);
      local_24 = *piVar4;
      HighsCDouble::HighsCDouble(&local_38,0.0);
      pvVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI,(long)local_24);
      pvVar5->hi = local_38.hi;
      pvVar5->lo = local_38.lo;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_18);
    }
  }
  else {
    this_00 = (vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
              std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::size(in_RDI);
    HighsCDouble::HighsCDouble(&local_48,0.0);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::assign
              (this_00,(size_type)in_stack_ffffffffffffff98,(value_type *)0x602520);
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x60252e);
  return;
}

Assistant:

void clear() {
    if (10 * nonzeroinds.size() < 3 * values.size())
      for (HighsInt i : nonzeroinds) values[i] = 0.0;
    else
      values.assign(values.size(), false);

    nonzeroinds.clear();
  }